

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int ProvideInput(Context *context)

{
  FILE *__stream;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  Context *context_local;
  
  sVar2 = fread(context->input,1,0x80000,(FILE *)context->fin);
  context->available_in = sVar2;
  context->total_in = context->available_in + context->total_in;
  context->next_in = context->input;
  iVar1 = ferror((FILE *)context->fin);
  __stream = _stderr;
  if (iVar1 != 0) {
    pcVar3 = PrintablePath(context->current_input_path);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(__stream,"failed to read input [%s]: %s\n",pcVar3,pcVar5);
  }
  context_local._4_4_ = (uint)(iVar1 == 0);
  return context_local._4_4_;
}

Assistant:

static BROTLI_BOOL ProvideInput(Context* context) {
  context->available_in =
      fread(context->input, 1, kFileBufferSize, context->fin);
  context->total_in += context->available_in;
  context->next_in = context->input;
  if (ferror(context->fin)) {
    fprintf(stderr, "failed to read input [%s]: %s\n",
            PrintablePath(context->current_input_path), strerror(errno));
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}